

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Entity_State_PDU::operator==(Entity_State_PDU *this,Entity_State_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Entity_State_PDU *Value_local;
  Entity_State_PDU *this_local;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EntityID,&Value->m_EntityID);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else if (this->m_ui8ForceID == Value->m_ui8ForceID) {
      if (this->m_ui8NumOfVariableParams == Value->m_ui8NumOfVariableParams) {
        KVar1 = DATA_TYPE::EntityType::operator!=(&this->m_EntityType,&Value->m_EntityType);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          KVar1 = DATA_TYPE::EntityType::operator!=(&this->m_AltEntityType,&Value->m_AltEntityType);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else {
            KVar1 = DATA_TYPE::Vector::operator!=
                              (&this->m_EntityLinearVelocity,&Value->m_EntityLinearVelocity);
            if (KVar1) {
              this_local._7_1_ = false;
            }
            else {
              KVar1 = DATA_TYPE::WorldCoordinates::operator!=
                                (&this->m_EntityLocation,&Value->m_EntityLocation);
              if (KVar1) {
                this_local._7_1_ = false;
              }
              else {
                KVar1 = DATA_TYPE::EulerAngles::operator!=
                                  (&this->m_EntityOrientation,&Value->m_EntityOrientation);
                if (KVar1) {
                  this_local._7_1_ = false;
                }
                else {
                  KVar1 = DATA_TYPE::EntityAppearance::operator!=
                                    (&this->m_EntityAppearance,&Value->m_EntityAppearance);
                  if (KVar1) {
                    this_local._7_1_ = false;
                  }
                  else {
                    KVar1 = DATA_TYPE::DeadReckoningParameter::operator!=
                                      (&this->m_DeadReckoningParameter,
                                       &Value->m_DeadReckoningParameter);
                    if (KVar1) {
                      this_local._7_1_ = false;
                    }
                    else {
                      KVar1 = DATA_TYPE::EntityMarking::operator!=
                                        (&this->m_EntityMarking,&Value->m_EntityMarking);
                      if (KVar1) {
                        this_local._7_1_ = false;
                      }
                      else {
                        KVar1 = DATA_TYPE::EntityCapabilities::operator!=
                                          (&this->m_EntityCapabilities,&Value->m_EntityCapabilities)
                        ;
                        if (KVar1) {
                          this_local._7_1_ = false;
                        }
                        else {
                          bVar2 = std::operator!=(&this->m_vVariableParameters,
                                                  &Value->m_vVariableParameters);
                          if (bVar2) {
                            this_local._7_1_ = false;
                          }
                          else {
                            this_local._7_1_ = true;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Entity_State_PDU::operator == ( const Entity_State_PDU & Value ) const
{
    if( Header::operator              !=( Value ) )                              return false;
    if( m_EntityID                    != Value.m_EntityID )                      return false;
    if( m_ui8ForceID                  != Value.m_ui8ForceID )                    return false;
    if( m_ui8NumOfVariableParams  != Value.m_ui8NumOfVariableParams )            return false;
    if( m_EntityType                  != Value.m_EntityType )                    return false;
    if( m_AltEntityType               != Value.m_AltEntityType )                 return false;
    if( m_EntityLinearVelocity        != Value.m_EntityLinearVelocity )          return false;
    if( m_EntityLocation              != Value.m_EntityLocation )                return false;
    if( m_EntityOrientation           != Value.m_EntityOrientation )             return false;
    if( m_EntityAppearance            != Value.m_EntityAppearance )              return false;
    if( m_DeadReckoningParameter      != Value.m_DeadReckoningParameter )        return false;
    if( m_EntityMarking               != Value.m_EntityMarking )                 return false;
    if( m_EntityCapabilities          != Value.m_EntityCapabilities )            return false;
    if( m_vVariableParameters         != Value.m_vVariableParameters )           return false;
    return true;
}